

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

void __thiscall QPushButton::keyPressEvent(QPushButton *this,QKeyEvent *e)

{
  bool bVar1;
  int iVar2;
  QPushButtonPrivate *this_00;
  QKeyEvent *in_RSI;
  QPushButtonPrivate *d;
  QAbstractButton *in_stack_00000028;
  QPushButton *in_stack_ffffffffffffffd8;
  
  this_00 = d_func((QPushButton *)0x665c31);
  iVar2 = QKeyEvent::key(in_RSI);
  if ((iVar2 == 0x1000004 || iVar2 == 0x1000005) &&
     ((bVar1 = autoDefault(in_stack_ffffffffffffffd8), bVar1 ||
      (((byte)this_00->field_0x2c8 >> 2 & 1) != 0)))) {
    QAbstractButton::click((QAbstractButton *)this_00);
  }
  else {
    QAbstractButton::keyPressEvent(in_stack_00000028,(QKeyEvent *)this);
  }
  return;
}

Assistant:

void QPushButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPushButton);
    switch (e->key()) {
    case Qt::Key_Enter:
    case Qt::Key_Return:
        if (autoDefault() || d->defaultButton) {
            click();
            break;
        }
        Q_FALLTHROUGH();
    default:
        QAbstractButton::keyPressEvent(e);
    }
}